

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int testThread(void)

{
  void *local_28;
  void *result;
  int local_18;
  int res;
  int ret;
  uint repeat;
  uint i;
  
  result._4_4_ = 0;
  xmlInitParser();
  res = 0;
  do {
    if (499 < (uint)res) {
      return result._4_4_;
    }
    xmlLoadCatalog(catalog);
    nb_tests = nb_tests + 1;
    for (ret = 0; (uint)ret < 7; ret = ret + 1) {
      tid[(uint)ret] = 0xffffffffffffffff;
    }
    for (ret = 0; (uint)ret < 7; ret = ret + 1) {
      local_18 = pthread_create(tid + (uint)ret,(pthread_attr_t *)0x0,thread_specific_data,
                                threadParams + (uint)ret);
      if (local_18 != 0) {
        fprintf(_stderr,"pthread_create failed\n");
        return 1;
      }
      local_18 = 0;
    }
    for (ret = 0; (uint)ret < 7; ret = ret + 1) {
      local_18 = pthread_join(tid[(uint)ret],&local_28);
      if (local_18 != 0) {
        fprintf(_stderr,"pthread_join failed\n");
        return 1;
      }
      local_18 = 0;
    }
    xmlCatalogCleanup();
    for (ret = 0; (uint)ret < 7; ret = ret + 1) {
      if (threadParams[(uint)ret].okay == 0) {
        fprintf(_stderr,"Thread %d handling %s failed\n",(ulong)(uint)ret,
                threadParams[(uint)ret].filename);
        result._4_4_ = 1;
      }
    }
    res = res + 1;
  } while( true );
}

Assistant:

static int
testThread(void)
{
    unsigned int i, repeat;
    int ret;
    int res = 0;

    xmlInitParser();

    for (repeat = 0; repeat < 500; repeat++) {
        xmlLoadCatalog(catalog);
        nb_tests++;

        for (i = 0; i < num_threads; i++) {
            tid[i] = (pthread_t) - 1;
        }

        for (i = 0; i < num_threads; i++) {
            ret = pthread_create(&tid[i], 0, thread_specific_data,
                                 (void *) &threadParams[i]);
            if (ret != 0) {
                fprintf(stderr, "pthread_create failed\n");
                return (1);
            }
        }
        for (i = 0; i < num_threads; i++) {
            void *result;
            ret = pthread_join(tid[i], &result);
            if (ret != 0) {
                fprintf(stderr, "pthread_join failed\n");
                return (1);
            }
        }

        xmlCatalogCleanup();
        for (i = 0; i < num_threads; i++)
            if (threadParams[i].okay == 0) {
                fprintf(stderr, "Thread %d handling %s failed\n",
                        i, threadParams[i].filename);
                res = 1;
            }
    }
    return (res);
}